

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<char>::write_double<long_double,fmt::FormatSpec>
          (BasicWriter<char> *this,longdouble value,FormatSpec *spec)

{
  Buffer<char> *pBVar1;
  bool bVar2;
  bool bVar3;
  CharTraits<char> CVar4;
  int iVar5;
  Alignment AVar6;
  wchar_t wVar7;
  uint uVar8;
  CharTraits<char> *pCVar9;
  size_t sVar10;
  CharPtr p_00;
  char *__src;
  char *pcVar11;
  ulong uVar12;
  int in_R9D;
  uint local_fc;
  char *local_e8;
  char *local_e0;
  CharTraits<char> local_d1;
  CharPtr p;
  int result;
  size_t buffer_size;
  char *start;
  uint n;
  char fill;
  char *pcStack_88;
  uint width_for_sprintf;
  char *format_ptr;
  char format [10];
  uint width;
  size_t offset;
  CharPtr out_1;
  char *inf;
  size_t inf_size;
  CharPtr out;
  char *nan;
  size_t nan_size;
  char sign;
  bool upper;
  char type;
  FormatSpec *spec_local;
  longdouble value_local;
  BasicWriter<char> *this_local;
  
  _spec_local = value;
  nan_size._7_1_ = FormatSpec::type(spec);
  bVar3 = false;
  iVar5 = (int)nan_size._7_1_;
  if (nan_size._7_1_ == '\0') {
    nan_size._7_1_ = 'g';
  }
  else if ((iVar5 == 0x41) || (iVar5 - 0x45U < 3)) {
    bVar3 = true;
  }
  else if ((iVar5 != 0x61) && (2 < iVar5 - 0x65U)) {
    internal::report_unknown_type(nan_size._7_1_,"double");
  }
  nan_size._5_1_ = (CharTraits<char>)0x0;
  bVar2 = std::numeric_limits<fmt::internal::DummyInt>::isnegative((double)value);
  if (bVar2) {
    nan_size._5_1_ = (CharTraits<char>)0x2d;
    _spec_local = -value;
  }
  else {
    bVar2 = FormatSpec::flag(spec,1);
    if (bVar2) {
      bVar2 = FormatSpec::flag(spec,2);
      local_d1 = (CharTraits<char>)0x2b;
      if (!bVar2) {
        local_d1 = (CharTraits<char>)0x20;
      }
      nan_size._5_1_ = local_d1;
    }
  }
  bVar2 = std::numeric_limits<fmt::internal::DummyInt>::isnotanumber<long_double>(_spec_local);
  if (bVar2) {
    nan = (char *)0x4;
    if (bVar3) {
      local_e0 = " NAN";
    }
    else {
      local_e0 = " nan";
    }
    out = local_e0;
    if (nan_size._5_1_ == (CharTraits<char>)0x0) {
      nan = (char *)0x3;
      out = local_e0 + 1;
    }
    pCVar9 = (CharTraits<char> *)write_str<char>(this,out,(size_t)nan,&spec->super_AlignSpec);
    if (nan_size._5_1_ != (CharTraits<char>)0x0) {
      *pCVar9 = nan_size._5_1_;
    }
  }
  else {
    bVar2 = std::numeric_limits<fmt::internal::DummyInt>::isinfinity<long_double>(_spec_local);
    if (bVar2) {
      inf = (char *)0x4;
      if (bVar3) {
        local_e8 = " INF";
      }
      else {
        local_e8 = " inf";
      }
      out_1 = local_e8;
      if (nan_size._5_1_ == (CharTraits<char>)0x0) {
        inf = (char *)0x3;
        out_1 = local_e8 + 1;
      }
      pCVar9 = (CharTraits<char> *)write_str<char>(this,out_1,(size_t)inf,&spec->super_AlignSpec);
      if (nan_size._5_1_ != (CharTraits<char>)0x0) {
        *pCVar9 = nan_size._5_1_;
      }
    }
    else {
      register0x00000000 = Buffer<char>::size(this->buffer_);
      format._2_4_ = WidthSpec::width((WidthSpec *)spec);
      if (nan_size._5_1_ != (CharTraits<char>)0x0) {
        pBVar1 = this->buffer_;
        sVar10 = Buffer<char>::size(this->buffer_);
        if ((uint)format._2_4_ < 2) {
          local_fc = 1;
        }
        else {
          local_fc._0_1_ = format[2];
          local_fc._1_1_ = format[3];
          local_fc._2_1_ = format[4];
          local_fc._3_1_ = format[5];
        }
        Buffer<char>::reserve(pBVar1,sVar10 + local_fc);
        if (format._2_4_ != 0) {
          format._2_4_ = format._2_4_ + -1;
        }
        register0x00000000 = stack0xffffffffffffff90 + 1;
      }
      pcStack_88 = (char *)((long)&format_ptr + 3);
      format_ptr._2_1_ = 0x25;
      n._0_1_ = format[2];
      n._1_1_ = format[3];
      n._2_1_ = format[4];
      n._3_1_ = format[5];
      bVar3 = FormatSpec::flag(spec,8);
      if (bVar3) {
        pcVar11 = pcStack_88 + 1;
        *pcStack_88 = '#';
        pcStack_88 = pcVar11;
      }
      AVar6 = AlignSpec::align(&spec->super_AlignSpec);
      if (AVar6 == ALIGN_CENTER) {
        n = 0;
      }
      else {
        AVar6 = AlignSpec::align(&spec->super_AlignSpec);
        if (AVar6 == ALIGN_LEFT) {
          *pcStack_88 = '-';
          pcStack_88 = pcStack_88 + 1;
        }
        if (format._2_4_ != 0) {
          *pcStack_88 = '*';
          pcStack_88 = pcStack_88 + 1;
        }
      }
      iVar5 = FormatSpec::precision(spec);
      if (-1 < iVar5) {
        pcVar11 = pcStack_88 + 1;
        *pcStack_88 = '.';
        pcStack_88 = pcStack_88 + 2;
        *pcVar11 = '*';
      }
      append_float_length(this,&stack0xffffffffffffff78,_spec_local);
      *pcStack_88 = nan_size._7_1_;
      pcStack_88[1] = '\0';
      pcStack_88 = pcStack_88 + 1;
      wVar7 = WidthSpec::fill((WidthSpec *)spec);
      CVar4 = (CharTraits<char>)internal::BasicCharTraits<char>::cast(wVar7);
      while( true ) {
        while( true ) {
          sVar10 = Buffer<char>::capacity(this->buffer_);
          pcVar11 = (char *)(sVar10 - stack0xffffffffffffff90);
          buffer_size = (size_t)Buffer<char>::operator[](this->buffer_,stack0xffffffffffffff90);
          uVar8 = FormatSpec::precision(spec);
          iVar5 = internal::CharTraits<char>::format_float<long_double>
                            ((CharTraits<char> *)buffer_size,pcVar11,(long)&format_ptr + 2,
                             (char *)(ulong)n,uVar8,in_R9D,_spec_local);
          if (-1 < iVar5) break;
          pBVar1 = this->buffer_;
          sVar10 = Buffer<char>::capacity(this->buffer_);
          Buffer<char>::reserve(pBVar1,sVar10 + 1);
        }
        start._4_4_ = internal::to_unsigned<int>(iVar5);
        uVar12 = stack0xffffffffffffff90 + start._4_4_;
        sVar10 = Buffer<char>::capacity(this->buffer_);
        if (uVar12 < sVar10) break;
        Buffer<char>::reserve(this->buffer_,stack0xffffffffffffff90 + start._4_4_ + 1);
      }
      if (nan_size._5_1_ != (CharTraits<char>)0x0) {
        AVar6 = AlignSpec::align(&spec->super_AlignSpec);
        if (((AVar6 == ALIGN_RIGHT) ||
            (AVar6 = AlignSpec::align(&spec->super_AlignSpec), AVar6 == ALIGN_DEFAULT)) &&
           (*(CharTraits<char> *)buffer_size == (CharTraits<char>)0x20)) {
          *(CharTraits<char> *)(buffer_size + -1) = CVar4;
        }
        else {
          *(CharTraits<char> *)(buffer_size + -1) = nan_size._5_1_;
          nan_size._5_1_ = (CharTraits<char>)0x0;
        }
        start._4_4_ = start._4_4_ + 1;
      }
      AVar6 = AlignSpec::align(&spec->super_AlignSpec);
      if ((AVar6 == ALIGN_CENTER) &&
         (uVar8 = WidthSpec::width((WidthSpec *)spec), start._4_4_ < uVar8)) {
        format._2_4_ = WidthSpec::width((WidthSpec *)spec);
        p_00 = grow_buffer(this,(ulong)(uint)format._2_4_);
        pcVar11 = get(p_00);
        uVar8 = format._2_4_ - start._4_4_;
        __src = get(p_00);
        memmove(pcVar11 + (uVar8 >> 1),__src,(ulong)start._4_4_);
        uVar8 = WidthSpec::width((WidthSpec *)spec);
        fill_padding(p_00,uVar8,(ulong)start._4_4_,(int)(char)CVar4);
      }
      else {
        wVar7 = WidthSpec::fill((WidthSpec *)spec);
        if ((wVar7 != L' ') || (nan_size._5_1_ != (CharTraits<char>)0x0)) {
          while (*(char *)buffer_size == ' ') {
            *(CharTraits<char> *)buffer_size = CVar4;
            buffer_size = buffer_size + 1;
          }
          if (nan_size._5_1_ != (CharTraits<char>)0x0) {
            *(CharTraits<char> *)(buffer_size - 1) = nan_size._5_1_;
          }
        }
        grow_buffer(this,(ulong)start._4_4_);
      }
    }
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const Spec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}